

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

_Bool trans_MSR_bank(DisasContext_conflict1 *s,arg_MSR_bank *a)

{
  int rn;
  TCGContext_conflict1 *tcg_ctx;
  _Bool _Var1;
  uintptr_t o_2;
  TCGv_i32 pTVar2;
  TCGv_i32 pTVar3;
  TCGv_i32 pTVar4;
  uintptr_t o;
  uintptr_t o_1;
  uint uVar5;
  int local_60;
  int tgtmode;
  TCGTemp *local_58;
  TCGTemp *local_50;
  TCGTemp *local_48;
  TCGTemp *local_40;
  
  uVar5 = (uint)s->features;
  if ((uVar5 >> 9 & 1) == 0) {
    rn = a->rn;
    tcg_ctx = s->uc->tcg_ctx;
    tgtmode = 0;
    local_60 = 0;
    _Var1 = msr_banked_access_decode(s,a->r,a->sysm,rn,&tgtmode,&local_60);
    if (_Var1) {
      gen_set_condexec(s);
      gen_set_pc_im(s,s->pc_curr);
      pTVar2 = load_reg(s,rn);
      pTVar3 = tcg_const_i32_aarch64(tcg_ctx,tgtmode);
      pTVar4 = tcg_const_i32_aarch64(tcg_ctx,local_60);
      local_58 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      local_50 = (TCGTemp *)(pTVar2 + (long)tcg_ctx);
      local_48 = (TCGTemp *)(pTVar3 + (long)tcg_ctx);
      local_40 = (TCGTemp *)(pTVar4 + (long)tcg_ctx);
      tcg_gen_callN_aarch64(tcg_ctx,helper_msr_banked_aarch64,(TCGTemp *)0x0,4,&local_58);
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar3 + (long)tcg_ctx));
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar4 + (long)tcg_ctx));
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar2 + (long)tcg_ctx));
      (s->base).is_jmp = DISAS_TARGET_1;
    }
  }
  return (uVar5 >> 9 & 1) == 0;
}

Assistant:

static bool trans_MSR_bank(DisasContext *s, arg_MSR_bank *a)
{
    if (arm_dc_feature(s, ARM_FEATURE_M)) {
        return false;
    }
    gen_msr_banked(s, a->r, a->sysm, a->rn);
    return true;
}